

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage
          (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,QPDFPageObjectHelper *h)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/Widget",&local_39);
  QPDFPageObjectHelper::getAnnotations(__return_storage_ptr__,h,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFAnnotationObjectHelper>
QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage(QPDFPageObjectHelper h)
{
    return h.getAnnotations("/Widget");
}